

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtab.c
# Opt level: O0

void create_symbol_table(void)

{
  bucket **ppbVar1;
  int iVar2;
  bucket *pbVar3;
  bucket *bp;
  int i;
  
  symbol_table = (bucket **)malloc(0x2000);
  if (symbol_table == (bucket **)0x0) {
    no_space();
  }
  for (bp._4_4_ = 0; bp._4_4_ < 0x400; bp._4_4_ = bp._4_4_ + 1) {
    symbol_table[bp._4_4_] = (bucket *)0x0;
  }
  pbVar3 = make_bucket("error");
  pbVar3->index = 1;
  pbVar3->class = '\x01';
  ppbVar1 = symbol_table;
  last_symbol = pbVar3;
  first_symbol = pbVar3;
  iVar2 = hash("error");
  ppbVar1[iVar2] = pbVar3;
  return;
}

Assistant:

void create_symbol_table()
{
    register int i;
    register bucket *bp;

    symbol_table = (bucket **) MALLOC(TABLE_SIZE*sizeof(bucket *));
    if (symbol_table == 0) no_space();
    for (i = 0; i < TABLE_SIZE; i++)
	symbol_table[i] = 0;

    bp = make_bucket("error");
    bp->index = 1;
    bp->class = TERM;

    first_symbol = bp;
    last_symbol = bp;
    symbol_table[hash("error")] = bp;
}